

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double cosine_cdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if (b * -3.141592653589793 + a < x) {
    dVar2 = b * 3.141592653589793 + a;
    if (x <= dVar2) {
      dVar2 = (x - a) / b;
      dVar1 = sin(dVar2);
      return (dVar1 + dVar2) / 6.283185307179586 + 0.5;
    }
    if (dVar2 < x) {
      dVar1 = 1.0;
    }
  }
  return dVar1;
}

Assistant:

double cosine_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_CDF evaluates the Cosine CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameter of the PDF.
//    0.0 < B.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf = 0.0;
  const double r8_pi = 3.14159265358979323;
  double y;

  if ( x <= a - r8_pi * b )
  {
    cdf = 0.0;
  }
  else if ( x <= a + r8_pi * b )
  {
    y = ( x - a ) / b;

    cdf = 0.5 + ( y + sin ( y ) ) / ( 2.0 * r8_pi );
  }
  else if ( a + r8_pi * b < x )
  {
    cdf = 1.0;
  }

  return cdf;
}